

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::ShaderSource::ShaderSource
          (ShaderSource *this,SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,char *source,
          bool useSync,bool serverSync)

{
  char *__s;
  Shader *pSVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48;
  allocator<char> local_35 [19];
  undefined1 local_22;
  undefined1 local_21;
  bool serverSync_local;
  char *pcStack_20;
  bool useSync_local;
  char *source_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader_local;
  ShaderSource *this_local;
  
  local_22 = serverSync;
  local_21 = useSync;
  pcStack_20 = source;
  source_local = (char *)shader;
  shader_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)this;
  Operation::Operation(&this->super_Operation,"ShaderSource",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__ShaderSource_03277848;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  __s = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_source,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>
            (&local_48,&this->m_shader);
  Operation::modifyGLObject(&this->super_Operation,&local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(&local_48);
  pSVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  pSVar1->isDefined = true;
  return;
}

Assistant:

ShaderSource::ShaderSource (SharedPtr<Shader> shader, const char* source, bool useSync, bool serverSync)
	: Operation	("ShaderSource", useSync, serverSync)
	, m_shader	(shader)
	, m_source	(source)
{
	modifyGLObject(SharedPtr<Object>(m_shader));
	m_shader->isDefined = true;
}